

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O1

Call * __thiscall
wasm::I64ToI32Lowering::visitGenericCall<wasm::Call>
          (I64ToI32Lowering *this,Call *curr,BuilderFunc<wasm::Call> *callBuilder)

{
  size_t sVar1;
  uintptr_t uVar2;
  Builder *pBVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  bool bVar6;
  bool bVar7;
  Call *value;
  LocalSet *any;
  Expression *pEVar8;
  LocalSet *append;
  Block *pBVar9;
  Call *expression;
  ulong uVar10;
  undefined1 local_a0 [8];
  TempVar highBits;
  TempVar lowBits;
  undefined1 auStack_58 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  Type local_38;
  
  bVar6 = handleUnreachable(this,(Expression *)curr);
  if (bVar6) {
    value = (Call *)0x0;
  }
  else {
    auStack_58 = (undefined1  [8])0x0;
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sVar1 = (curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    if (sVar1 == 0) {
      bVar6 = false;
    }
    else {
      bVar6 = false;
      uVar10 = 0;
      do {
        if ((curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= uVar10) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        local_a0 = (undefined1  [8])
                   (curr->operands).
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                   [uVar10];
        if (args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
            .super__Vector_impl_data._M_start ==
            args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
            .super__Vector_impl_data._M_finish) {
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          _M_realloc_insert<wasm::Expression*const&>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_58,
                     (iterator)
                     args.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,(Expression **)local_a0);
        }
        else {
          *args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
           super__Vector_impl_data._M_start = (Expression *)local_a0;
          args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_start =
               args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
               _M_impl.super__Vector_impl_data._M_start + 1;
        }
        bVar7 = hasOutParam(this,(Expression *)local_a0);
        if (bVar7) {
          fetchOutParam((TempVar *)&highBits.ty,this,(Expression *)local_a0);
          if ((char)lowBits.pass == '\x01') goto LAB_008e2174;
          uVar5 = (Index)highBits.ty.id;
          local_38.id = (uintptr_t)
                        MixedArena::allocSpace
                                  (&((this->builder)._M_t.
                                     super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                     .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->
                                    wasm->allocator,0x18,8);
          (((Block *)local_38.id)->super_SpecificExpression<(wasm::Expression::Id)1>).
          super_Expression._id = LocalGetId;
          *(undefined4 *)&(((Block *)local_38.id)->name).super_IString.str._M_len = uVar5;
          (((Block *)local_38.id)->super_SpecificExpression<(wasm::Expression::Id)1>).
          super_Expression.type.id = 2;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_58,
                     (Expression **)&local_38);
          TempVar::~TempVar((TempVar *)&highBits.ty);
          bVar6 = true;
        }
        uVar10 = uVar10 + 1;
      } while (sVar1 != uVar10);
    }
    uVar2 = (curr->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id;
    if (uVar2 == 3) {
      getTemp((TempVar *)&highBits.ty,this,(Type)0x2);
      getTemp((TempVar *)local_a0,this,(Type)0x2);
      local_38.id = 2;
      if ((callBuilder->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      value = (*callBuilder->_M_invoker)
                        ((_Any_data *)callBuilder,
                         (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         auStack_58,&local_38);
      if ((char)lowBits.pass == '\x01') {
LAB_008e2174:
        __assert_fail("!moved",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                      ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
      }
      any = Builder::makeLocalSet
                      ((this->builder)._M_t.
                       super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                       super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                       (Index)highBits.ty.id,(Expression *)value);
      uVar2 = DAT_010d12c8;
      uVar4 = INT64_TO_32_HIGH_BITS;
      if ((char)highBits.pass == '\x01') goto LAB_008e2174;
      pBVar3 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      uVar5 = local_a0._0_4_;
      pEVar8 = (Expression *)MixedArena::allocSpace(&pBVar3->wasm->allocator,0x20,8);
      pEVar8->_id = GlobalGetId;
      (pEVar8->type).id = 0;
      *(undefined8 *)(pEVar8 + 1) = 0;
      *(undefined8 *)(pEVar8 + 1) = uVar4;
      pEVar8[1].type.id = uVar2;
      (pEVar8->type).id = 2;
      append = Builder::makeLocalSet(pBVar3,uVar5,pEVar8);
      if ((char)lowBits.pass == '\x01') goto LAB_008e2174;
      uVar5 = (Index)highBits.ty.id;
      pEVar8 = (Expression *)
               MixedArena::allocSpace
                         (&((this->builder)._M_t.
                            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                            .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                           allocator,0x18,8);
      pEVar8->_id = LocalGetId;
      *(undefined4 *)(pEVar8 + 1) = uVar5;
      (pEVar8->type).id = 2;
      pBVar3 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      pBVar9 = Builder::blockify(pBVar3,(Expression *)any,(Expression *)append);
      pBVar9 = Builder::blockify(pBVar3,(Expression *)pBVar9,pEVar8);
      local_38.id = (uintptr_t)pBVar9;
      std::
      _Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<wasm::Expression*&,wasm::I64ToI32Lowering::TempVar>
                ((_Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->highBitVars,&local_38,local_a0);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)pBVar9);
      TempVar::~TempVar((TempVar *)local_a0);
      TempVar::~TempVar((TempVar *)&highBits.ty);
    }
    else {
      highBits.ty.id = uVar2;
      if ((callBuilder->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      expression = (*callBuilder->_M_invoker)
                             ((_Any_data *)callBuilder,
                              (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                              auStack_58,&highBits.ty);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)expression);
      value = (Call *)0x0;
      if (bVar6) {
        value = expression;
      }
    }
    if (auStack_58 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_58,
                      (long)args.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
    }
  }
  return value;
}

Assistant:

T* visitGenericCall(T* curr, BuilderFunc<T> callBuilder) {
    if (handleUnreachable(curr)) {
      return nullptr;
    }
    bool fixed = false;
    std::vector<Expression*> args;
    for (auto* e : curr->operands) {
      args.push_back(e);
      if (hasOutParam(e)) {
        TempVar argHighBits = fetchOutParam(e);
        args.push_back(builder->makeLocalGet(argHighBits, Type::i32));
        fixed = true;
      }
    }
    if (curr->type != Type::i64) {
      auto* ret = callBuilder(args, curr->type);
      replaceCurrent(ret);
      return fixed ? ret : nullptr;
    }
    TempVar lowBits = getTemp();
    TempVar highBits = getTemp();
    auto* call = callBuilder(args, Type::i32);
    LocalSet* doCall = builder->makeLocalSet(lowBits, call);
    LocalSet* setHigh = builder->makeLocalSet(
      highBits, builder->makeGlobalGet(INT64_TO_32_HIGH_BITS, Type::i32));
    LocalGet* getLow = builder->makeLocalGet(lowBits, Type::i32);
    Block* result = builder->blockify(doCall, setHigh, getLow);
    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
    return call;
  }